

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool saveKeyPresses<short>(string *fname,TKeyPressCollectionT<short> *keyPresses)

{
  long lVar1;
  long lVar2;
  int n;
  ofstream fout;
  int local_224;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220,(string *)fname,_S_bin);
  local_224 = (int)((ulong)((long)(keyPresses->
                                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                  ).
                                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(keyPresses->
                                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 ).
                                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
  std::ostream::write((char *)&local_220,(long)&local_224);
  if (0 < local_224) {
    lVar2 = 0x10;
    lVar1 = 0;
    do {
      std::ostream::write((char *)&local_220,
                          (long)&(((keyPresses->
                                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                   ).
                                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->waveform).samples +
                          lVar2);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x30;
    } while (lVar1 < local_224);
  }
  std::ofstream::close();
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _SDL_GetNumAudioDevices;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return true;
}

Assistant:

bool saveKeyPresses(const std::string & fname, const TKeyPressCollectionT<T> & keyPresses) {
    std::ofstream fout(fname, std::ios::binary);
    int n = keyPresses.size();
    fout.write((char *)(&n), sizeof(n));
    for (int i = 0; i < n; ++i) {
        fout.write((char *)(&keyPresses[i].pos), sizeof(keyPresses[i].pos));
    }
    fout.close();

    return true;
}